

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# botp.c
# Opt level: O1

err_t botpTOTPVerify(char *otp,octet *key,size_t key_len,tm_time_t t)

{
  bool_t bVar1;
  int iVar2;
  size_t sVar3;
  size_t *state;
  err_t eVar4;
  botp_totp_st *st;
  
  bVar1 = strIsValid(otp);
  eVar4 = 0x206;
  if (((bVar1 != 0) && (sVar3 = strLen(otp), 5 < sVar3)) && (sVar3 = strLen(otp), sVar3 < 9)) {
    if (t == -1) {
      eVar4 = 0x133;
    }
    else {
      bVar1 = memIsValid(key,key_len);
      if (bVar1 == 0) {
        eVar4 = 0x6d;
      }
      else {
        sVar3 = beltHMAC_keep();
        state = (size_t *)blobCreate(sVar3 * 2 + 0x40);
        if (state == (size_t *)0x0) {
          eVar4 = 0x6e;
        }
        else {
          sVar3 = strLen(otp);
          *state = sVar3;
          sVar3 = beltHMAC_keep();
          beltHMACStart((void *)((long)state + sVar3 + 0x3a),key,key_len);
          botpTOTPStepR((char *)(state + 6),t,state);
          iVar2 = strCmp((char *)(state + 6),otp);
          blobClose(state);
          eVar4 = 0x206;
          if (iVar2 == 0) {
            eVar4 = 0;
          }
        }
      }
    }
  }
  return eVar4;
}

Assistant:

err_t botpTOTPVerify(const char* otp, const octet key[], size_t key_len, 
	tm_time_t t)
{
	void* state;
	bool_t success;
	// проверить входные данные
	if (!strIsValid(otp) || strLen(otp) < 6 || strLen(otp) > 8)
		return ERR_BAD_PWD;
	if (t == TIME_ERR)
		return ERR_BAD_TIME;
	if (!memIsValid(key, key_len))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(botpTOTP_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// проверить пароль
	botpTOTPStart(state, strLen(otp), key, key_len);
	success = botpTOTPStepV(otp, t, state);
	// завершить
	blobClose(state);
	return success ? ERR_OK : ERR_BAD_PWD;
}